

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.h
# Opt level: O3

Rectangle<float> __thiscall
Rml::Rectangle<float>::IntersectIfValid(Rectangle<float> *this,Rectangle<float> other)

{
  Rectangle<float> RVar1;
  
  if (((((this->p0).x <= (this->p1).x) && ((this->p0).y <= (this->p1).y)) &&
      (other.p0.x <= other.p1.x)) && (other.p0.y <= other.p1.y)) {
    RVar1 = Intersect(this,other);
    return RVar1;
  }
  return *this;
}

Assistant:

bool Valid() const { return p0.x <= p1.x && p0.y <= p1.y; }